

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O0

void addBeta1(NeuralNetwork *nn,OptimizerTypeCase optimizerType,double defaultValue,double minValue,
             double maxValue)

{
  NetworkUpdateParameters *this;
  Optimizer *this_00;
  DoubleParameter *this_01;
  DoubleRange *this_02;
  DoubleRange *doubleRange;
  DoubleParameter *beta1;
  AdamOptimizer *realOptimizer;
  Optimizer *optimizer;
  NetworkUpdateParameters *updateParameters;
  double maxValue_local;
  double minValue_local;
  double defaultValue_local;
  OptimizerTypeCase optimizerType_local;
  NeuralNetwork *nn_local;
  
  this = CoreML::Specification::NeuralNetwork::mutable_updateparams(nn);
  this_00 = CoreML::Specification::NetworkUpdateParameters::mutable_optimizer(this);
  beta1 = (DoubleParameter *)0x0;
  if (optimizerType == kAdamOptimizer) {
    beta1 = (DoubleParameter *)CoreML::Specification::Optimizer::mutable_adamoptimizer(this_00);
  }
  this_01 = CoreML::Specification::AdamOptimizer::mutable_beta1((AdamOptimizer *)beta1);
  CoreML::Specification::DoubleParameter::set_defaultvalue(this_01,defaultValue);
  this_02 = CoreML::Specification::DoubleParameter::mutable_range(this_01);
  CoreML::Specification::DoubleRange::set_minvalue(this_02,minValue);
  CoreML::Specification::DoubleRange::set_maxvalue(this_02,maxValue);
  return;
}

Assistant:

void addBeta1(Specification::NeuralNetwork *nn, Specification::Optimizer::OptimizerTypeCase optimizerType, double defaultValue, double minValue, double maxValue) {
    
    auto updateParameters = nn->mutable_updateparams();
    auto optimizer = updateParameters->mutable_optimizer();
    auto realOptimizer = (::CoreML::Specification::AdamOptimizer*)NULL;
    
    switch (optimizerType) {
        case Specification::Optimizer::kAdamOptimizer:
            realOptimizer = optimizer->mutable_adamoptimizer();
            break;
        default:
            break;
    }
    
    auto beta1 = realOptimizer->mutable_beta1();
    
    beta1->set_defaultvalue(defaultValue);
    
    auto doubleRange = beta1->mutable_range();
    doubleRange->set_minvalue(minValue);
    doubleRange->set_maxvalue(maxValue);
}